

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_getnameinfo.c
# Opt level: O0

char * lookup_service(unsigned_short port,uint flags,char *buf,size_t buflen)

{
  uint16_t uVar1;
  int iVar2;
  size_t sVar3;
  size_t name_len;
  char *name;
  char tmpbuf [4096];
  servent se;
  servent *sep;
  char *proto;
  size_t buflen_local;
  char *buf_local;
  uint flags_local;
  unsigned_short port_local;
  
  if (port == 0) {
    *buf = '\0';
    _flags_local = (char *)0x0;
  }
  else {
    if ((flags & 8) == 0) {
      if ((flags & 0x10) == 0) {
        if ((flags & 0x20) == 0) {
          if ((flags & 0x40) == 0) {
            sep = (servent *)anon_var_dwarf_6358;
          }
          else {
            sep = (servent *)anon_var_dwarf_634e;
          }
        }
        else {
          sep = (servent *)anon_var_dwarf_6338;
        }
      }
      else {
        sep = (servent *)anon_var_dwarf_6322;
      }
      memset(tmpbuf + 0xff8,0,0x20);
      se.s_proto = tmpbuf + 0xff8;
      memset(&name,0,0x1000);
      iVar2 = getservbyport_r((uint)port,(char *)sep,(servent *)(tmpbuf + 0xff8),(char *)&name,
                              0x1000,(servent **)&se.s_proto);
      if (iVar2 != 0) {
        se.s_proto = (char *)0x0;
      }
    }
    else {
      se.s_proto = (char *)0x0;
    }
    if ((se.s_proto == (char *)0x0) || (*(long *)se.s_proto == 0)) {
      uVar1 = ntohs(port);
      snprintf((char *)&name,0x1000,"%u",(ulong)uVar1);
      name_len = (size_t)&name;
    }
    else {
      name_len = *(size_t *)se.s_proto;
    }
    sVar3 = ares_strlen((char *)name_len);
    _flags_local = buf;
    if (sVar3 < buflen) {
      memcpy(buf,(void *)name_len,sVar3 + 1);
    }
    else {
      *buf = '\0';
    }
  }
  return _flags_local;
}

Assistant:

static char *lookup_service(unsigned short port, unsigned int flags, char *buf,
                            size_t buflen)
{
  const char     *proto;
  struct servent *sep;
#ifdef HAVE_GETSERVBYPORT_R
  struct servent se;
#endif
  char        tmpbuf[4096];
  const char *name;
  size_t      name_len;

  if (port) {
    if (flags & ARES_NI_NUMERICSERV) {
      sep = NULL;
    } else {
      if (flags & ARES_NI_UDP) {
        proto = "udp";
      } else if (flags & ARES_NI_SCTP) {
        proto = "sctp";
      } else if (flags & ARES_NI_DCCP) {
        proto = "dccp";
      } else {
        proto = "tcp";
      }
#ifdef HAVE_GETSERVBYPORT_R
      memset(&se, 0, sizeof(se));
      sep = &se;
      memset(tmpbuf, 0, sizeof(tmpbuf));
#  if GETSERVBYPORT_R_ARGS == 6
      if (getservbyport_r(port, proto, &se, (void *)tmpbuf, sizeof(tmpbuf),
                          &sep) != 0) {
        sep = NULL; /* LCOV_EXCL_LINE: buffer large so this never fails */
      }
#  elif GETSERVBYPORT_R_ARGS == 5
      sep = getservbyport_r(port, proto, &se, (void *)tmpbuf, sizeof(tmpbuf));
#  elif GETSERVBYPORT_R_ARGS == 4
      if (getservbyport_r(port, proto, &se, (void *)tmpbuf) != 0) {
        sep = NULL;
      }
#  else
      /* Lets just hope the OS uses TLS! */
      sep = getservbyport(port, proto);
#  endif
#else
      /* Lets just hope the OS uses TLS! */
#  if (defined(NETWARE) && !defined(__NOVELL_LIBC__))
      sep = getservbyport(port, (char *)proto);
#  else
      sep = getservbyport(port, proto);
#  endif
#endif
    }
    if (sep && sep->s_name) {
      /* get service name */
      name = sep->s_name;
    } else {
      /* get port as a string */
      snprintf(tmpbuf, sizeof(tmpbuf), "%u", (unsigned int)ntohs(port));
      name = tmpbuf;
    }
    name_len = ares_strlen(name);
    if (name_len < buflen) {
      /* return it if buffer big enough */
      memcpy(buf, name, name_len + 1);
    } else {
      /* avoid reusing previous one */
      buf[0] = '\0'; /* LCOV_EXCL_LINE: no real service names are too big */
    }
    return buf;
  }
  buf[0] = '\0';
  return NULL;
}